

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O3

void __thiscall FBaseCVar::CmdSet(FBaseCVar *this,char *newval)

{
  char *format;
  
  SetGenericRep(this,(UCVarValue)newval,CVAR_String);
  if ((this->Flags & 8) == 0) {
    if ((this->Flags & 0x10) == 0) {
      return;
    }
    format = "%s will be changed for next game.\n";
  }
  else {
    format = "%s is write protected.\n";
  }
  Printf(format,this->Name);
  return;
}

Assistant:

void FBaseCVar::CmdSet (const char *newval)
{
	UCVarValue val;

	// Casting away the const is safe in this case.
	val.String = const_cast<char *>(newval);        
	SetGenericRep (val, CVAR_String);

	if (GetFlags() & CVAR_NOSET)
		Printf ("%s is write protected.\n", GetName());
	else if (GetFlags() & CVAR_LATCH)
		Printf ("%s will be changed for next game.\n", GetName());
}